

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O0

value_type_conflict7 * __thiscall
poplar::compact_fkhash_nlm<int,_16UL>::append(compact_fkhash_nlm<int,_16UL> *this,char_range *key)

{
  bool bVar1;
  type_conflict *ptVar2;
  type_conflict *ptVar3;
  uint64_t uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  uchar *puVar6;
  size_type sVar7;
  char_range *in_RSI;
  long in_RDI;
  size_t i;
  uint64_t length;
  type_conflict *pos_in_chunk;
  type_conflict *chunk_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  uint64_t in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff88;
  uint8_t *__last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  compact_fkhash_nlm<int,_16UL> *in_stack_ffffffffffffffb0;
  ulong uVar8;
  
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  decompose_value<16ul>(in_stack_ffffffffffffff80);
  ptVar2 = std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x2210a9)
  ;
  ptVar3 = std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x2210b8)
  ;
  if ((*ptVar2 != 0) && (*ptVar3 == 0)) {
    release_buf_(in_stack_ffffffffffffffb0);
  }
  bVar1 = char_range::empty(in_RSI);
  if (bVar1) {
    pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  }
  else {
    uVar4 = char_range::length(in_RSI);
    pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(uVar4 - 1);
  }
  __result.container = pvVar5;
  vbyte::append(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __last = in_RSI->begin;
  pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           (in_RSI->begin +
           (long)&(pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl);
  std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff78);
  std::
  copy<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((uchar *)pvVar5,__last,__result);
  for (uVar8 = 0; uVar8 < 4; uVar8 = uVar8 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<char>
              (pvVar5,(char *)__last);
  }
  puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2211bc);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x18));
  return (value_type_conflict7 *)(puVar6 + (sVar7 - 4));
}

Assistant:

value_type* append(const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(size_++);
        if (chunk_id != 0 && pos_in_chunk == 0) {
            release_buf_();
        }

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        uint64_t length = key.empty() ? 0 : key.length() - 1;
        vbyte::append(chunk_buf_, length + sizeof(value_type));
        std::copy(key.begin, key.begin + length, std::back_inserter(chunk_buf_));
        for (size_t i = 0; i < sizeof(value_type); ++i) {
            chunk_buf_.emplace_back('\0');
        }

        return reinterpret_cast<value_type*>(chunk_buf_.data() + chunk_buf_.size() - sizeof(value_type));
    }